

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBStringList::splitstr(CBStringList *this,CBString *b,CBString *s)

{
  uchar splitChar;
  int iVar1;
  long lVar2;
  int iVar3;
  CBString local_48;
  
  iVar3 = (s->super_tagbstring).slen;
  if (iVar3 != 1) {
    if (iVar3 == 0) {
      for (lVar2 = 0; lVar2 < (b->super_tagbstring).slen; lVar2 = lVar2 + 1) {
        CBString::CBString(&local_48,(b->super_tagbstring).data[lVar2]);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
        emplace_back<Bstrlib::CBString>
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
        CBString::~CBString(&local_48);
      }
    }
    else {
      iVar3 = 0;
      while( true ) {
        iVar1 = binstr(&b->super_tagbstring,iVar3,&s->super_tagbstring);
        if (iVar1 < 0) break;
        CBString::midstr(&local_48,b,iVar3,iVar1 - iVar3);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
        emplace_back<Bstrlib::CBString>
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
        CBString::~CBString(&local_48);
        iVar3 = iVar1 + (s->super_tagbstring).slen;
      }
      iVar1 = (b->super_tagbstring).slen;
      if (iVar3 <= iVar1) {
        CBString::midstr(&local_48,b,iVar3,iVar1 - iVar3);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
        emplace_back<Bstrlib::CBString>
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
        CBString::~CBString(&local_48);
      }
    }
    return;
  }
  splitChar = CBString::character(s,0);
  split(this,b,splitChar);
  return;
}

Assistant:

void CBStringList::splitstr (const CBString& b, const CBString& s) {
int p, i;

	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else if (s.length() == 0) {
		for (i=0; i < b.length (); i++) {
			this->push_back (CBString (b.data[i]));
		}
	} else {
		for (p=0; (i = b.find (s, p)) >= 0; p = i + s.length ()) {
			this->push_back (b.midstr (p, i - p));
		}
		if (p <= b.length ()) {
			this->push_back (b.midstr (p, b.length () - p));
		}
	}
}